

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O3

int crypto_sign(uchar *sm,unsigned_long_long *smlen,uchar *m,unsigned_long_long mlen,uchar *sk)

{
  long lVar1;
  int iVar2;
  size_t signature_len;
  picnic_privatekey_t psk;
  long local_a0;
  undefined1 local_91 [97];
  
  iVar2 = -3;
  if (*sk == '\x01') {
    local_a0 = 0x84f0;
    iVar2 = picnic_read_private_key(local_91,sk,0x31);
    if (iVar2 < 0) {
      picnic_clear_private_key(local_91);
    }
    else {
      iVar2 = picnic_sign(local_91,m,mlen,sm + mlen + 4,&local_a0);
      picnic_clear_private_key(local_91);
      lVar1 = local_a0;
      if (iVar2 == 0) {
        *smlen = mlen + 4 + local_a0;
        memmove(sm + 4,m,mlen);
        iVar2 = 0;
        *(int *)sm = (int)lVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int crypto_sign(unsigned char* sm, unsigned long long* smlen, const unsigned char* m,
                unsigned long long mlen, const unsigned char* sk) {
  // The first byte encodes the parameter set and is public.
  picnic_declassify(&sk[0], sizeof(unsigned char));
  if (sk[0] != Picnic_L1_FS) {
    return -3;
  }

  size_t signature_len = PICNIC_SIGNATURE_SIZE(Picnic_L1_FS);
  uint32_t len         = 0;

  picnic_privatekey_t psk;
  int ret = picnic_read_private_key(&psk, sk, PICNIC_PRIVATE_KEY_SIZE(Picnic_L1_FS));
  if (ret < 0) {
    picnic_clear_private_key(&psk);
    return ret;
  }

  ret = picnic_sign(&psk, m, mlen, sm + sizeof(len) + mlen, &signature_len);
  picnic_clear_private_key(&psk);
  if (ret) {
    return ret;
  }

  len    = htole32(signature_len);
  *smlen = sizeof(len) + mlen + signature_len;
  // Move the message first in case m and sm overlap.
  memmove(sm + sizeof(len), m, mlen);
  memcpy(sm, &len, sizeof(len));

  return 0;
}